

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.cpp
# Opt level: O0

bool error_registers(int n,int regnumber)

{
  bool bVar1;
  ostream *poVar2;
  int in_ESI;
  int in_EDI;
  
  bVar1 = in_ESI + -1 < in_EDI;
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"<!> Overflow. Register \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_EDI);
    poVar2 = std::operator<<(poVar2,"\' does not exist.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return bVar1;
}

Assistant:

bool error_registers(int n, int regnumber)
{

    if( n > ( regnumber - 1 ) )
    {
        std::cerr << "<!> Overflow. Register '" << n << "' does not exist." << std::endl;
        return true;
    }

    return false;

}